

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O3

int luaD_poscall(lua_State *L,StkId firstResult)

{
  short sVar1;
  CallInfo *pCVar2;
  int iVar3;
  uint uVar4;
  CallInfo *pCVar5;
  StkId pTVar6;
  StkId pTVar7;
  int iVar8;
  TValue *io2;
  
  pCVar2 = L->ci;
  if ((L->hookmask & 6) == 0) {
    pCVar5 = pCVar2->previous;
  }
  else {
    if ((L->hookmask & 2) != 0) {
      pTVar7 = L->stack;
      luaD_hook(L,1,-1);
      firstResult = (StkId)(((long)firstResult - (long)pTVar7) + (long)L->stack);
    }
    pCVar5 = pCVar2->previous;
    L->oldpc = (pCVar5->u).l.savedpc;
  }
  pTVar7 = pCVar2->func;
  sVar1 = pCVar2->nresults;
  iVar3 = (int)sVar1;
  L->ci = pCVar5;
  if (sVar1 != 0) {
    iVar8 = 0;
    pTVar6 = pTVar7;
    do {
      if (L->top <= firstResult) {
        pTVar7 = pTVar6;
        if (0 < iVar3 - iVar8) {
          uVar4 = (iVar3 + 1) - iVar8;
          do {
            pTVar6->tt_ = 0;
            pTVar6 = pTVar6 + 1;
            uVar4 = uVar4 - 1;
            pTVar7 = pTVar6;
          } while (1 < uVar4);
        }
        break;
      }
      pTVar7 = pTVar6 + 1;
      pTVar6->value_ = firstResult->value_;
      pTVar6->tt_ = firstResult->tt_;
      iVar8 = iVar8 + 1;
      firstResult = firstResult + 1;
      pTVar6 = pTVar7;
    } while (iVar3 != iVar8);
  }
  L->top = pTVar7;
  return iVar3 + 1;
}

Assistant:

int luaD_poscall (lua_State *L, StkId firstResult) {
  StkId res;
  int wanted, i;
  CallInfo *ci = L->ci;
  if (L->hookmask & (LUA_MASKRET | LUA_MASKLINE)) {
    if (L->hookmask & LUA_MASKRET) {
      ptrdiff_t fr = savestack(L, firstResult);  /* hook may change stack */
      luaD_hook(L, LUA_HOOKRET, -1);
      firstResult = restorestack(L, fr);
    }
    L->oldpc = ci->previous->u.l.savedpc;  /* 'oldpc' for caller function */
  }
  res = ci->func;  /* res == final position of 1st result */
  wanted = ci->nresults;
  L->ci = ci = ci->previous;  /* back to caller */
  /* move results to correct place */
  for (i = wanted; i != 0 && firstResult < L->top; i--)
    setobjs2s(L, res++, firstResult++);
  while (i-- > 0)
    setnilvalue(res++);
  L->top = res;
  return (wanted - LUA_MULTRET);  /* 0 iff wanted == LUA_MULTRET */
}